

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O2

void __thiscall SortedRun::do_or(SortedRun *this,SortedRun *other)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  decompress(this);
  decompress(other);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = begin(other);
  iVar5 = end(other);
  iVar6 = begin(this);
  iVar7 = end(this);
  std::
  __set_union<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (iVar4._M_current,iVar5._M_current,iVar6._M_current,iVar7._M_current,&local_38);
  puVar2 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar3 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_finish;
  puVar1 = (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_38._M_impl.super__Vector_impl_data._M_start;
  (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = local_38._M_impl.super__Vector_impl_data._M_finish;
  (this->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38._M_impl.super__Vector_impl_data._M_start = puVar2;
  local_38._M_impl.super__Vector_impl_data._M_finish = puVar3;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = puVar1;
  Catch::clara::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void SortedRun::do_or(SortedRun &other) {
    // In almost every case this is already decompressed.
    decompress();
    other.decompress();
    std::vector<FileId> new_results;
    std::set_union(other.begin(), other.end(), begin(), end(),
                   std::back_inserter(new_results));
    std::swap(new_results, sequence_);
}